

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cc
# Opt level: O0

Vector6d *
gmath::combineError(Vector6d *pose0,Vector6d *pose1,Vector6d *pose0_err,Vector6d *pose1_err)

{
  double dVar1;
  double *pdVar2;
  SVector<double,_6> *in_RCX;
  SVector<double,_6> *in_RDI;
  SVector<double,_6> *in_R8;
  double dVar3;
  int i_2;
  int k_1;
  Vector6d p_1;
  int i_1;
  int k;
  Vector6d p;
  int i;
  Vector6d pose;
  Vector6d *perr;
  SVector<double,_6> *in_stack_fffffffffffffe38;
  SVector<double,_6> *in_stack_fffffffffffffe40;
  int local_190;
  int local_18c;
  SVector<double,_6> local_158;
  SVector<double,_6> local_128;
  int local_f8;
  int local_f4;
  Vector6d *in_stack_ffffffffffffff50;
  Vector6d *in_stack_ffffffffffffff58;
  Vector6d *in_stack_ffffffffffffff70;
  Vector6d *in_stack_ffffffffffffff78;
  int local_5c;
  
  combine(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  SVector<double,_6>::SVector(in_RDI);
  for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
    SVector<double,_6>::SVector(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    dVar3 = SVector<double,_6>::operator[](in_RCX,local_5c);
    pdVar2 = SVector<double,_6>::operator[]((SVector<double,_6> *)&stack0xffffffffffffff70,local_5c)
    ;
    *pdVar2 = dVar3 + *pdVar2;
    combine(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    anon_unknown_5::diff(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    SVector<double,_6>::operator=
              ((SVector<double,_6> *)&stack0xffffffffffffff70,
               (SVector<double,_6> *)&stack0xffffffffffffff40);
    for (local_f4 = 0; local_f4 < 6; local_f4 = local_f4 + 1) {
      pdVar2 = SVector<double,_6>::operator[]
                         ((SVector<double,_6> *)&stack0xffffffffffffff70,local_f4);
      dVar3 = *pdVar2;
      pdVar2 = SVector<double,_6>::operator[]
                         ((SVector<double,_6> *)&stack0xffffffffffffff70,local_f4);
      dVar1 = *pdVar2;
      pdVar2 = SVector<double,_6>::operator[](in_RDI,local_f4);
      *pdVar2 = dVar3 * dVar1 + *pdVar2;
    }
  }
  for (local_f8 = 0; local_f8 < 6; local_f8 = local_f8 + 1) {
    SVector<double,_6>::SVector(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe40 = (SVector<double,_6> *)SVector<double,_6>::operator[](in_R8,local_f8)
    ;
    pdVar2 = SVector<double,_6>::operator[](&local_128,local_f8);
    *pdVar2 = (double)in_stack_fffffffffffffe40 + *pdVar2;
    combine(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    anon_unknown_5::diff(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    SVector<double,_6>::operator=(&local_128,&local_158);
    for (local_18c = 0; local_18c < 6; local_18c = local_18c + 1) {
      pdVar2 = SVector<double,_6>::operator[](&local_128,local_18c);
      dVar3 = *pdVar2;
      pdVar2 = SVector<double,_6>::operator[](&local_128,local_18c);
      in_stack_fffffffffffffe38 = (SVector<double,_6> *)*pdVar2;
      pdVar2 = SVector<double,_6>::operator[](in_RDI,local_18c);
      *pdVar2 = dVar3 * (double)in_stack_fffffffffffffe38 + *pdVar2;
    }
  }
  for (local_190 = 0; local_190 < 6; local_190 = local_190 + 1) {
    pdVar2 = SVector<double,_6>::operator[](in_RDI,local_190);
    dVar3 = sqrt(*pdVar2);
    pdVar2 = SVector<double,_6>::operator[](in_RDI,local_190);
    *pdVar2 = dVar3;
  }
  return in_RDI;
}

Assistant:

Vector6d combineError(const Vector6d &pose0, const Vector6d &pose1,
                      const Vector6d &pose0_err, const Vector6d &pose1_err)
{
  Vector6d pose=combine(pose0, pose1);
  Vector6d perr;

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose0;
    p[i]+=pose0_err[i];

    p=diff(combine(p, pose1), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    Vector6d p=pose1;
    p[i]+=pose1_err[i];

    p=diff(combine(pose0, p), pose);

    for (int k=0; k<6; k++)
    {
      perr[k]+=p[k]*p[k];
    }
  }

  for (int i=0; i<6; i++)
  {
    perr[i]=sqrt(perr[i]);
  }

  return perr;
}